

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O1

BrotliDecoderErrorCode
duckdb_brotli::DecodeVarLenUint8(BrotliDecoderStateInternal *s,BrotliBitReader *br,uint64_t *value)

{
  ulong uVar1;
  BrotliRunningDecodeUint8State BVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t in_R8;
  byte *pbVar7;
  bool bVar8;
  
  BVar2 = s->substate_decode_uint8;
  if (BVar2 == BROTLI_STATE_DECODE_UINT8_LONG) goto LAB_01d662d1;
  if (BVar2 != BROTLI_STATE_DECODE_UINT8_SHORT) {
    if (BVar2 != BROTLI_STATE_DECODE_UINT8_NONE) {
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
    uVar3 = br->bit_pos_;
    bVar8 = uVar3 == 0;
    if (bVar8) {
      pbVar7 = br->next_in;
      if (pbVar7 != br->last_in) {
        br->val_ = br->val_ | (ulong)*pbVar7;
        br->bit_pos_ = 8;
        br->next_in = pbVar7 + 1;
        uVar3 = 8;
        bVar8 = false;
        goto LAB_01d6624e;
      }
    }
    else {
LAB_01d6624e:
      in_R8 = (uint64_t)((uint)br->val_ & 1);
      br->bit_pos_ = uVar3 - 1;
      br->val_ = br->val_ >> 1;
    }
    if (bVar8) {
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    if (in_R8 == 0) {
      *value = 0;
      return BROTLI_DECODER_SUCCESS;
    }
  }
  uVar4 = br->bit_pos_;
  bVar8 = uVar4 < 3;
  if (bVar8) {
    pbVar7 = br->next_in;
    if (pbVar7 != br->last_in) {
      br->val_ = br->val_ | (ulong)*pbVar7 << ((byte)uVar4 & 0x3f);
      uVar4 = uVar4 | 8;
      br->bit_pos_ = uVar4;
      br->next_in = pbVar7 + 1;
      bVar8 = false;
      goto LAB_01d662a8;
    }
  }
  else {
LAB_01d662a8:
    in_R8 = (uint64_t)((uint)br->val_ & 7);
    br->bit_pos_ = uVar4 - 3;
    br->val_ = br->val_ >> 3;
  }
  if (bVar8) {
    s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  if (in_R8 == 0) {
    *value = 1;
    s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
    return BROTLI_DECODER_SUCCESS;
  }
  *value = in_R8;
LAB_01d662d1:
  uVar4 = *value;
  uVar5 = br->bit_pos_;
  bVar8 = uVar5 < uVar4;
  if (bVar8) {
    pbVar7 = br->next_in;
    if (pbVar7 != br->last_in) {
      uVar6 = br->val_;
      do {
        uVar6 = (ulong)*pbVar7 << ((byte)uVar5 & 0x3f) | uVar6;
        br->val_ = uVar6;
        uVar1 = uVar5 + 8;
        br->bit_pos_ = uVar1;
        pbVar7 = pbVar7 + 1;
        br->next_in = pbVar7;
        bVar8 = uVar1 < uVar4;
        if (!bVar8) {
          uVar5 = uVar5 + 8;
          goto LAB_01d66348;
        }
        uVar5 = uVar1;
      } while (pbVar7 != br->last_in);
    }
  }
  else {
LAB_01d66348:
    in_R8 = *(ulong *)(kBrotliBitMask + uVar4 * 8) & br->val_;
    br->bit_pos_ = uVar5 - uVar4;
    br->val_ = br->val_ >> ((byte)uVar4 & 0x3f);
  }
  if (bVar8) {
    s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  *value = in_R8 + (uint)(1 << ((byte)*value & 0x1f));
  s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
  return BROTLI_DECODER_SUCCESS;
}

Assistant:

static BROTLI_NOINLINE BrotliDecoderErrorCode DecodeVarLenUint8(BrotliDecoderState *s, BrotliBitReader *br,
                                                                brotli_reg_t *value) {
	brotli_reg_t bits;
	switch (s->substate_decode_uint8) {
	case BROTLI_STATE_DECODE_UINT8_NONE:
		if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 1, &bits))) {
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		if (bits == 0) {
			*value = 0;
			return BROTLI_DECODER_SUCCESS;
		}
		/* Fall through. */

	case BROTLI_STATE_DECODE_UINT8_SHORT:
		if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 3, &bits))) {
			s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		if (bits == 0) {
			*value = 1;
			s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
			return BROTLI_DECODER_SUCCESS;
		}
		/* Use output value as a temporary storage. It MUST be persisted. */
		*value = bits;
		/* Fall through. */

	case BROTLI_STATE_DECODE_UINT8_LONG:
		if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, *value, &bits))) {
			s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		*value = (1U << *value) + bits;
		s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
		return BROTLI_DECODER_SUCCESS;

	default:
		return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
	}
}